

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O3

FaceHandle __thiscall OpenMesh::PolyConnectivity::remove_edge(PolyConnectivity *this,EdgeHandle _eh)

{
  HalfedgeHandle _heh;
  HalfedgeHandle _heh_00;
  HalfedgeHandle _nheh;
  HalfedgeHandle _nheh_00;
  VertexHandle _vh;
  HalfedgeHandle _heh_01;
  undefined4 _vh_00;
  bool bVar1;
  reference pvVar2;
  Halfedge *pHVar3;
  Vertex *pVVar4;
  Face *pFVar5;
  HalfedgeHandle _heh_02;
  BaseHandle _fh;
  BaseHandle BVar6;
  undefined1 local_68 [8];
  FaceHalfedgeIter fh_it;
  FaceHandle local_34;
  
  pvVar2 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).edge_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (EdgeHandle)_eh.super_BaseHandle.idx_);
  if (((pvVar2->status_ & 1) != 0) || (bVar1 = is_simple_link(this,_eh), !bVar1)) {
    __assert_fail("!status(_eh).deleted() && is_simple_link(_eh)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x362,
                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::remove_edge(EdgeHandle)"
                 );
  }
  _heh_01.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2);
  _heh_02.super_BaseHandle.idx_ = (BaseHandle)((int)_eh.super_BaseHandle.idx_ * 2 + 1);
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  BVar6.idx_ = (pHVar3->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  local_34.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar3->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_;
  _fh.idx_ = BVar6.idx_;
  if ((local_34.super_BaseHandle.idx_ == -1) &&
     (_fh.idx_ = -1, local_34.super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)BVar6.idx_,
     BVar6.idx_ == -1)) {
    __assert_fail("del_fh.is_valid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                  ,0x36d,
                  "PolyConnectivity::FaceHandle OpenMesh::PolyConnectivity::remove_edge(EdgeHandle)"
                 );
  }
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  _heh.super_BaseHandle.idx_ = (BaseHandle)(pHVar3->prev_halfedge_handle_).super_BaseHandle.idx_;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _heh_00.super_BaseHandle.idx_ = (BaseHandle)(pHVar3->prev_halfedge_handle_).super_BaseHandle.idx_;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  _nheh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar3->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  _nheh_00.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar3->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_
  ;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh,_nheh_00);
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
       (int)_heh_00.super_BaseHandle.idx_;
  ArrayKernel::set_next_halfedge_handle(&this->super_ArrayKernel,_heh_00,_nheh);
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_01);
  _vh.super_BaseHandle.idx_ =
       (BaseHandle)(pHVar3->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pHVar3 = ArrayKernel::halfedge(&this->super_ArrayKernel,_heh_02);
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ =
       (pHVar3->super_Halfedge_without_prev).vertex_handle_.super_BaseHandle.idx_;
  pVVar4 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
  if ((BaseHandle)(pVVar4->halfedge_handle_).super_BaseHandle.idx_ == _heh_02.super_BaseHandle.idx_)
  {
    pVVar4 = ArrayKernel::vertex(&this->super_ArrayKernel,_vh);
    (pVVar4->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh.super_BaseHandle.idx_;
  }
  _vh_00 = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_;
  pVVar4 = ArrayKernel::vertex(&this->super_ArrayKernel,
                               (VertexHandle)
                               fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_
                              );
  if ((BaseHandle)(pVVar4->halfedge_handle_).super_BaseHandle.idx_ == _heh_01.super_BaseHandle.idx_)
  {
    pVVar4 = ArrayKernel::vertex(&this->super_ArrayKernel,(VertexHandle)_vh_00);
    (pVVar4->halfedge_handle_).super_BaseHandle.idx_ = (int)_nheh_00.super_BaseHandle.idx_;
  }
  pFVar5 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh.idx_);
  BVar6.idx_ = fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
  if (((BaseHandle)(pFVar5->halfedge_handle_).super_BaseHandle.idx_ == _heh_01.super_BaseHandle.idx_
      ) || (pFVar5 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh.idx_),
           BVar6.idx_ = (int)_heh.super_BaseHandle.idx_,
           (BaseHandle)(pFVar5->halfedge_handle_).super_BaseHandle.idx_ ==
           _heh_02.super_BaseHandle.idx_)) {
    pFVar5 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh.idx_);
    (pFVar5->halfedge_handle_).super_BaseHandle.idx_ = BVar6.idx_;
  }
  pFVar5 = ArrayKernel::face(&this->super_ArrayKernel,(FaceHandle)_fh.idx_);
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ =
       (pFVar5->halfedge_handle_).super_BaseHandle.idx_;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.idx_ =
       (BaseHandle)0x0;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_ =
       (BaseHandle)0xffffffff;
  local_68 = (undefined1  [8])this;
  fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ =
       fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_;
  if (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ != -1) {
    do {
      if ((fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._0_4_ ==
           fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_) &&
         (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
          idx_ != 0)) break;
      pHVar3 = ArrayKernel::halfedge
                         (&this->super_ArrayKernel,
                          (HalfedgeHandle)
                          fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_
                         );
      (pHVar3->super_Halfedge_without_prev).face_handle_.super_BaseHandle.idx_ = _fh.idx_;
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_68);
    } while (fh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_._4_4_ != -1);
  }
  pvVar2 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (EPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).edge_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      (EdgeHandle)_eh.super_BaseHandle.idx_);
  *(byte *)&pvVar2->status_ = (byte)pvVar2->status_ | 1;
  pvVar2 = BaseKernel::property<OpenMesh::Attributes::StatusInfo>
                     ((BaseKernel *)this,
                      (FPropHandleT<OpenMesh::Attributes::StatusInfo>)
                      (this->super_ArrayKernel).face_status_.
                      super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_,
                      local_34);
  *(byte *)&pvVar2->status_ = (byte)pvVar2->status_ | 1;
  return (BaseHandle)(BaseHandle)_fh.idx_;
}

Assistant:

PolyConnectivity::FaceHandle 
PolyConnectivity::remove_edge(EdgeHandle _eh)
{
  //don't allow "dangling" vertices and edges
  assert(!status(_eh).deleted() && is_simple_link(_eh));
  
  HalfedgeHandle heh0 = halfedge_handle(_eh, 0);
  HalfedgeHandle heh1 = halfedge_handle(_eh, 1);
  
  //deal with the faces
  FaceHandle rem_fh = face_handle(heh0), del_fh = face_handle(heh1);
  if (!del_fh.is_valid())
  {//boundary case - we must delete the rem_fh
    std::swap(del_fh, rem_fh);
  }
  assert(del_fh.is_valid());
/*  for (FaceHalfedgeIter fh_it = fh_iter(del_fh); fh_it; ++fh_it)
  {//set the face handle of the halfedges of del_fh to point to rem_fh
    set_face_handle(fh_it, rem_fh);  
  } */
  //fix the halfedge relations
  HalfedgeHandle prev_heh0 = prev_halfedge_handle(heh0);
  HalfedgeHandle prev_heh1 = prev_halfedge_handle(heh1);

  HalfedgeHandle next_heh0 = next_halfedge_handle(heh0);
  HalfedgeHandle next_heh1 = next_halfedge_handle(heh1);
  
  set_next_halfedge_handle(prev_heh0, next_heh1);
  set_next_halfedge_handle(prev_heh1, next_heh0);
  //correct outgoing vertex handles for the _eh vertices (if needed)
  VertexHandle vh0 = to_vertex_handle(heh0);
  VertexHandle vh1 = to_vertex_handle(heh1);
  
  if (halfedge_handle(vh0) == heh1)
  {
    set_halfedge_handle(vh0, next_heh0);
  }
  if (halfedge_handle(vh1) == heh0)
  {
    set_halfedge_handle(vh1, next_heh1);
  }
  
  //correct the hafledge handle of rem_fh if needed and preserve its first vertex
  if (halfedge_handle(rem_fh) == heh0)
  {//rem_fh is the face at heh0
    set_halfedge_handle(rem_fh, prev_heh1);
  }
  else if (halfedge_handle(rem_fh) == heh1)
  {//rem_fh is the face at heh1
    set_halfedge_handle(rem_fh, prev_heh0);
  }
  for (FaceHalfedgeIter fh_it = fh_iter(rem_fh); fh_it.is_valid(); ++fh_it)
  {//set the face handle of the halfedges of del_fh to point to rem_fh
    set_face_handle(*fh_it, rem_fh);
  } 
  
  status(_eh).set_deleted(true);  
  status(del_fh).set_deleted(true);  
  return rem_fh;//returns the remaining face handle
}